

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall TArray<line_t,_line_t>::Push(TArray<line_t,_line_t> *this,line_t_conflict *item)

{
  line_t_conflict *plVar1;
  uint uVar2;
  vertex_t *pvVar3;
  double dVar4;
  long lVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  byte bVar8;
  
  bVar8 = 0;
  Grow(this,1);
  pvVar3 = item->v2;
  plVar1 = this->Array + this->Count;
  plVar1->v1 = item->v1;
  plVar1->v2 = pvVar3;
  dVar4 = (item->delta).Y;
  (plVar1->delta).X = (item->delta).X;
  (plVar1->delta).Y = dVar4;
  puVar6 = &item->flags;
  puVar7 = &plVar1->flags;
  for (lVar5 = 0x74; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(char *)puVar7 = (char)*puVar6;
    puVar6 = (uint32_t *)((long)puVar6 + (ulong)bVar8 * -2 + 1);
    puVar7 = (uint32_t *)((long)puVar7 + (ulong)bVar8 * -2 + 1);
  }
  uVar2 = this->Count;
  this->Count = uVar2 + 1;
  return uVar2;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}